

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void getHighestScore(int *score)

{
  int iVar1;
  char cVar2;
  int *piVar3;
  long *plVar4;
  char *pcVar5;
  ostream *poVar6;
  int iVar7;
  long lVar8;
  string input;
  unique_lock<std::mutex> lck;
  fstream result;
  fstream previous_result;
  undefined1 auStack_498 [4];
  int local_494;
  int *local_490;
  char *local_488;
  undefined8 local_480;
  char local_478;
  undefined7 uStack_477;
  unique_lock<std::mutex> local_468;
  char *local_458;
  long local_450 [2];
  ostream local_440 [16];
  byte abStack_430 [496];
  long local_240 [4];
  byte abStack_220 [496];
  
  local_488 = &local_478;
  local_480 = 0;
  local_478 = '\0';
  local_490 = score;
  std::fstream::fstream((istream *)local_240);
  std::fstream::fstream(local_450);
  if (Mycontroller::quit == false) {
    iVar7 = 0;
    do {
      local_468._M_device = &mtx;
      local_468._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_468);
      local_468._M_owns = true;
      std::condition_variable::wait((unique_lock *)con_var);
      std::fstream::open((char *)local_240,0x108004);
      if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) == 0) {
        cVar2 = std::ios::widen((char)auStack_498 + (char)*(long *)(local_240[0] + -0x18) + 'X');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_240,(string *)&local_488,cVar2);
        pcVar5 = local_488;
        local_494 = iVar7;
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        *piVar3 = 0;
        lVar8 = strtol(pcVar5,&local_458,10);
        if (local_458 == pcVar5) {
          pcVar5 = (char *)std::__throw_invalid_argument("stoi");
LAB_00103b0e:
          std::unique_lock<std::mutex>::~unique_lock(&local_468);
          std::fstream::~fstream(local_450);
          std::fstream::~fstream(local_240);
          if (local_488 != &local_478) {
            operator_delete(local_488,CONCAT71(uStack_477,local_478) + 1);
          }
          _Unwind_Resume(pcVar5);
        }
        iVar7 = (int)lVar8;
        if ((iVar7 != lVar8) || (*piVar3 == 0x22)) {
          pcVar5 = "stoi";
          std::__throw_out_of_range("stoi");
          goto LAB_00103b0e;
        }
        if (*piVar3 == 0) {
          *piVar3 = iVar1;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nDone reading from file\n",0x18);
        Mycontroller::highestScore = iVar7;
        std::fstream::close();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\n Can\'t read the previous record \n",0x22);
        std::ios::clear((int)*(undefined8 *)(local_240[0] + -0x18) + (int)(istream *)local_240);
      }
      iVar1 = *local_490;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"score = ",8);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,*local_490);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      if (iVar7 < iVar1) {
        std::fstream::open((char *)local_450,0x108004);
        lVar8 = 0x27;
        poVar6 = (ostream *)&std::cerr;
        pcVar5 = "\nfailed to create ..file not available\n";
        if ((abStack_430[*(long *)(local_450[0] + -0x18)] & 5) == 0) {
          lVar8 = 0x11;
          std::ostream::operator<<(local_440,*local_490);
          poVar6 = (ostream *)&std::cout;
          pcVar5 = "\nwrote into file\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,lVar8);
        std::fstream::close();
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_468);
    } while (Mycontroller::quit == false);
  }
  std::fstream::~fstream(local_450);
  std::fstream::~fstream(local_240);
  if (local_488 != &local_478) {
    operator_delete(local_488,CONCAT71(uStack_477,local_478) + 1);
  }
  return;
}

Assistant:

void getHighestScore(int& score){
  int r{0};
  std::string  input;
  std::fstream previous_result;
 std::fstream result;
 while(!Mycontroller::quit){

  std::unique_lock<std::mutex> lck(mtx);
  con_var.wait(lck );

  previous_result.open("result.txt", std::ios::in);
  if(!previous_result){
    std::cerr << "\n Can't read the previous record \n" ;
    previous_result.clear();
  } else{
    try{  
      std::getline(previous_result,input);
      r = std::stoi(input);
      std::cout<<"\nDone reading from file\n";

      Mycontroller::highestScore = r;
    }catch(std::exception& e){
      std::cout << e.what();
    }

   previous_result.close();
  }

 
bool newScore = r < score;
// std::cout << "\nnew score is " << newScore <<std::endl;
// std::cout << "r = " << r << std::endl;

std::cout << "score = " << score << std::endl;

  if(newScore){
    result.open("result.txt", std::ios::out);
    if(!result){
      std::cerr << "\nfailed to create ..file not available\n" ;
    }
    else{
      result << score;
      std::cout<<"\nwrote into file\n";
    }
    result.close();
  }


  }
}